

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Namco.cpp
# Opt level: O2

void __thiscall Nes_Namco::reset(Nes_Namco *this)

{
  long lVar1;
  
  this->addr_reg = 0;
  for (lVar1 = 0; lVar1 != 0x80; lVar1 = lVar1 + 1) {
    this->reg[lVar1] = '\0';
  }
  for (lVar1 = 0x12; lVar1 != 0xd2; lVar1 = lVar1 + 0x18) {
    *(undefined8 *)((long)this->oscs + lVar1 + -0x12) = 0;
    *(undefined4 *)((long)this->oscs + lVar1 + -2) = 0;
  }
  return;
}

Assistant:

void Nes_Namco::reset()
{
	addr_reg = 0;
	
	int i;
	for ( i = 0; i < reg_count; i++ )
		reg [i] = 0;
	
	for ( i = 0; i < osc_count; i++ )
	{
		Namco_Osc& osc = oscs [i];
		osc.delay = 0;
		osc.last_amp = 0;
		osc.wave_pos = 0;
	}
}